

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu511.c
# Opt level: O1

MPP_RET hal_h264e_vepu511_start(void *hal,HalEncTask *task)

{
  long lVar1;
  bool bVar2;
  MPP_RET MVar3;
  MPP_RET MVar4;
  char *fmt;
  MppDevRegWrCfg wr_cfg;
  MppDevRegRdCfg rd_cfg;
  long local_50 [3];
  undefined8 local_38;
  
  lVar1 = *(long *)((long)hal + 400);
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu511","enter %p\n","hal_h264e_vepu511_start",hal);
  }
  local_50[1] = 0x124;
  local_50[0] = lVar1;
  MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_50);
  if (MVar3 == MPP_OK) {
    local_50[0] = lVar1 + 0x124;
    local_50[1] = 0x270000002cc;
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_50);
    if (MVar3 == MPP_OK) {
      local_50[0] = lVar1 + 0x3f0;
      local_50[1] = 0x100000000164;
      MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_50);
      if (MVar3 == MPP_OK) {
        local_50[0] = lVar1 + 0x554;
        local_50[1] = 0x1700000002cc;
        MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_50);
        if (MVar3 == MPP_OK) {
          local_50[0] = lVar1 + 0x820;
          local_50[1] = 0x20000000016c;
          MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_50);
          if (MVar3 == MPP_OK) {
            local_50[0] = lVar1 + 0x98c;
            local_50[1] = 0x220000000490;
            MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_50);
            if (MVar3 == MPP_OK) {
              local_50[0] = lVar1 + 0xe1c;
              local_50[1] = 0x300000000268;
              MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_50);
              if (MVar3 == MPP_OK) {
                MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),7,*(void **)((long)hal + 0x38));
                if (MVar3 == MPP_OK) {
                  local_50[2] = lVar1 + 0x2c;
                  local_38 = 0x2c00000004;
                  MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,local_50 + 2);
                  if (MVar3 == MPP_OK) {
                    local_50[2] = lVar1 + 0x1084;
                    local_38 = 0x400000000250;
                    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,local_50 + 2);
                    if (MVar3 == MPP_OK) {
                      MVar3 = MPP_OK;
                      MVar4 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0xf,(void *)0x0);
                      if (MVar4 == MPP_OK) {
                        bVar2 = false;
                      }
                      else {
                        _mpp_log_l(2,"hal_h264e_vepu511","send cmd failed %d\n",
                                   "hal_h264e_vepu511_start",(ulong)(uint)MVar4);
                        bVar2 = false;
                        MVar3 = MVar4;
                      }
                      goto LAB_0023227b;
                    }
                  }
                  fmt = "set register read failed %d\n";
                }
                else {
                  fmt = "set register offsets failed %d\n";
                }
                _mpp_log_l(2,"hal_h264e_vepu511",fmt,"hal_h264e_vepu511_start",(ulong)(uint)MVar3);
                bVar2 = false;
              }
              else {
                _mpp_log_l(2,"hal_h264e_vepu511","set register write failed %d\n",
                           "hal_h264e_vepu511_start",(ulong)(uint)MVar3);
                bVar2 = true;
              }
              goto LAB_0023227b;
            }
          }
        }
      }
    }
  }
  bVar2 = false;
  _mpp_log_l(2,"hal_h264e_vepu511","set register write failed %d\n","hal_h264e_vepu511_start",
             (ulong)(uint)MVar3);
LAB_0023227b:
  if ((!bVar2) && (((byte)hal_h264e_debug & 2) != 0)) {
    _mpp_log_l(4,"hal_h264e_vepu511","leave %p\n","hal_h264e_vepu511_start",hal);
  }
  return MVar3;
}

Assistant:

static MPP_RET hal_h264e_vepu511_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepu511Ctx *ctx = (HalH264eVepu511Ctx *)hal;
    HalVepu511RegSet *regs = ctx->regs_set;

    (void) task;

    hal_h264e_dbg_func("enter %p\n", hal);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &regs->reg_ctl;
        wr_cfg.size = sizeof(regs->reg_ctl);
        wr_cfg.offset = VEPU511_CTL_OFFSET;
#if DUMP_REG
        {
            RK_U32 i;
            RK_U32 *reg = (RK_U32)wr_cfg.reg;
            for ( i = 0; i < sizeof(regs->reg_ctl) / sizeof(RK_U32); i++) {
                mpp_log("reg[%d] = 0x%08x\n", i, reg[i]);
            }

        }
#endif
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_frm;
        wr_cfg.size = sizeof(regs->reg_frm);
        wr_cfg.offset = VEPU511_FRAME_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_rc_roi;
        wr_cfg.size = sizeof(regs->reg_rc_roi);
        wr_cfg.offset = VEPU511_RC_ROI_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_param;
        wr_cfg.size = sizeof(regs->reg_param);
        wr_cfg.offset = VEPU511_PARAM_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_sqi;
        wr_cfg.size = sizeof(regs->reg_sqi);
        wr_cfg.offset = VEPU511_SQI_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_scl;
        wr_cfg.size = sizeof(regs->reg_scl);
        wr_cfg.offset = VEPU511_SCL_OFFSET ;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_osd;
        wr_cfg.size = sizeof(regs->reg_osd);
        wr_cfg.offset = VEPU511_OSD_OFFSET ;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            return ret;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_OFFS, ctx->offsets);
        if (ret) {
            mpp_err_f("set register offsets failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->reg_ctl.int_sta;
        rd_cfg.size = sizeof(RK_U32);
        rd_cfg.offset = VEPU511_REG_BASE_HW_STATUS;
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->reg_st;
        rd_cfg.size = sizeof(regs->reg_st);
        rd_cfg.offset = VEPU511_STATUS_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        /* send request to hardware */
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_h264e_dbg_func("leave %p\n", hal);

    return ret;
}